

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O0

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::readVectorsFromFile
          (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this,char *filename,bool withTimeStamp)

{
  value_type vVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  size_type sVar6;
  reference pvVar7;
  Scalar *pSVar8;
  size_type local_428;
  Index i;
  bool readingVector;
  double component;
  vector<double,_std::allocator<double>_> doublecontainer;
  stringstream ss;
  int local_26c;
  undefined1 local_268 [3];
  bool continuation;
  int k;
  Vector v;
  string s;
  istream local_228 [8];
  ifstream f;
  bool withTimeStamp_local;
  char *filename_local;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  reset(this);
  std::ifstream::ifstream(local_228);
  std::ifstream::open((char *)local_228,(_Ios_Openmode)filename);
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::string
              ((string *)
               &v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_268);
    local_26c = 0;
    bVar2 = true;
    while (bVar2) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_228,
                 (string *)
                 &v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)
                 &doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (string *)
                 &v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 _Var5);
      if (withTimeStamp) {
        std::istream::operator>>
                  ((istream *)
                   &doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_26c);
      }
      bVar4 = std::ios::fail();
      if ((bVar4 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&component);
        bVar3 = true;
        while (bVar3) {
          std::istream::operator>>
                    ((istream *)
                     &doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(double *)&stack0xfffffffffffffbe8);
          bVar4 = std::ios::fail();
          if ((bVar4 & 1) == 0) {
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)&component,
                       (value_type *)&stack0xfffffffffffffbe8);
          }
          else {
            bVar3 = false;
          }
        }
        sVar6 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)&component);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_268,sVar6);
        for (local_428 = 0;
            sVar6 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)&component),
            (long)local_428 < (long)sVar6; local_428 = local_428 + 1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&component,local_428);
          vVar1 = *pvVar7;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              local_268,local_428);
          *pSVar8 = vVar1;
        }
        setValue(this,(Matrix<double,__1,_1,_0,__1,_1> *)local_268,(long)local_26c);
        local_26c = local_26c + 1;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)&component);
      }
      else {
        bVar2 = false;
      }
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)
                 &doublecontainer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_268);
    std::__cxx11::string::~string
              ((string *)
               &v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readVectorsFromFile(const char * filename, bool withTimeStamp )
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {
    std::string s;
    Vector v;
    int k=0;

    bool continuation=true;

    while (continuation)
    {
      std::getline(f,s);

      std::stringstream ss(s);

      if (withTimeStamp)
      {
        ss >> k;
      }



      if (f.fail())
        continuation=false;
      else
      {
        std::vector<double> doublecontainer;
        double component;
        bool readingVector = true;
        while (readingVector)
        {
          ss>> component;

          if (ss.fail())
          {
            readingVector=false;
          }
          else
          {
            doublecontainer.push_back(component);
          }
        }
        v.resize(Index(doublecontainer.size()));
        for (Index i=0 ; i<Index(doublecontainer.size()) ; ++i)
        {
          v(i)=doublecontainer[size_t(i)];
        }
        setValue(v,k);
        ++k;

      }
    }
  }
}